

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O0

void __thiscall diffusion::ShmWriter::ShmWriter(ShmWriter *this,string *shm_name,Size shm_size)

{
  undefined8 uVar1;
  mapped_region *this_00;
  pointer pmVar2;
  char *pcVar3;
  size_t sVar4;
  __off_t __length;
  unique_ptr<boost::interprocess::mapped_region,std::default_delete<boost::interprocess::mapped_region>>
  local_40 [12];
  permissions local_34 [6];
  Size local_1c;
  string *psStack_18;
  Size shm_size_local;
  string *shm_name_local;
  ShmWriter *this_local;
  
  local_1c = shm_size;
  psStack_18 = shm_name;
  shm_name_local = (string *)this;
  Writer::Writer(&this->super_Writer);
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00113c00;
  std::__cxx11::string::string((string *)&this->shm_name_,(string *)psStack_18);
  uVar1 = std::__cxx11::string::c_str();
  boost::interprocess::permissions::permissions(local_34);
  boost::interprocess::shared_memory_object::shared_memory_object
            (&this->shm_object_,uVar1,2,local_34);
  std::
  unique_ptr<boost::interprocess::mapped_region,std::default_delete<boost::interprocess::mapped_region>>
  ::unique_ptr<std::default_delete<boost::interprocess::mapped_region>,void>
            ((unique_ptr<boost::interprocess::mapped_region,std::default_delete<boost::interprocess::mapped_region>>
              *)&this->shm_region_);
  this->writer_shm_body_offset_ = 0;
  boost::interprocess::shared_memory_object::truncate
            (&this->shm_object_,(char *)(long)local_1c,__length);
  this_00 = (mapped_region *)operator_new(0x20);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (this_00,&this->shm_object_,read_write,0,0,(void *)0x0,-1);
  std::
  unique_ptr<boost::interprocess::mapped_region,std::default_delete<boost::interprocess::mapped_region>>
  ::unique_ptr<std::default_delete<boost::interprocess::mapped_region>,void>(local_40,this_00);
  std::
  unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ::operator=(&this->shm_region_,
              (unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
               *)local_40);
  std::
  unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
                 *)local_40);
  pmVar2 = std::
           unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
           ::operator->(&this->shm_region_);
  pcVar3 = (char *)boost::interprocess::mapped_region::get_address(pmVar2);
  this->shm_header_position_ = pcVar3;
  this->shm_body_position_ = this->shm_header_position_ + 8;
  pmVar2 = std::
           unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
           ::operator->(&this->shm_region_);
  sVar4 = boost::interprocess::mapped_region::get_size(pmVar2);
  this->shm_body_size_ = (int)sVar4 + -8;
  return;
}

Assistant:

ShmWriter::ShmWriter(std::string const & shm_name, Size shm_size)
    : shm_name_(shm_name),
      shm_object_(boost::interprocess::create_only, shm_name.c_str(), boost::interprocess::read_write),
      writer_shm_body_offset_(0) {
    shm_object_.truncate(shm_size);
    shm_region_ = std::unique_ptr<boost::interprocess::mapped_region>(new boost::interprocess::mapped_region(shm_object_, boost::interprocess::read_write));
    shm_header_position_ = reinterpret_cast<char *>(shm_region_->get_address());
    shm_body_position_ = shm_header_position_ + kShmHeaderLength;
    shm_body_size_ = shm_region_->get_size() - kShmHeaderLength;
}